

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

bool tcu::anon_unknown_3::verifyMultisampleLineGroupRasterization
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               ClipMode clipMode)

{
  pointer pSVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pSVar7;
  uint uVar8;
  Vec4 *pVVar9;
  bool bVar10;
  int side;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Vec2 lineNormalDir;
  Vector<float,_2> local_158;
  Vec2 lineDir;
  Vector<float,_2> local_148;
  Vector<float,_2> local_140;
  Vec2 lineScreenSpace [2];
  Vector<float,_2> local_120;
  TriangleSceneSpec triangleScene;
  Vec2 lineQuadNormalizedDeviceSpace [4];
  Vector<float,_2> local_d0;
  Vec2 lineQuadScreenSpace [4];
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  
  uVar5 = surface->m_width;
  uVar6 = surface->m_height;
  local_158.m_data[0] = (float)(int)uVar5;
  local_158.m_data[1] = (float)(int)uVar6;
  fVar17 = scene->lineWidth;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&triangleScene.triangles,
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  fVar17 = fVar17 * 0.5;
  for (lVar16 = 0;
      pSVar7 = (scene->lines).
               super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar16 < (int)((ulong)((long)(scene->lines).
                                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7) >> 6);
      lVar16 = lVar16 + 1) {
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)pSVar7[lVar16].positions[0].m_data;
    fVar21 = *(float *)((long)pSVar7[lVar16].positions[0].m_data + 0xc);
    auVar22._4_4_ = fVar21;
    auVar22._0_4_ = fVar21;
    auVar22._8_8_ = 0;
    auVar19 = divps(auVar19,auVar22);
    local_148.m_data[0] = SUB84(auVar19._0_8_,0);
    local_148.m_data[1] = SUB84(auVar19._0_8_,4);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)pSVar7[lVar16].positions[1].m_data;
    fVar21 = *(float *)((long)(pSVar7[lVar16].positions + 1) + 0xc);
    auVar23._4_4_ = fVar21;
    auVar23._0_4_ = fVar21;
    auVar23._8_8_ = 0;
    auVar19 = divps(auVar20,auVar23);
    local_140.m_data[0] = SUB84(auVar19._0_8_,0);
    local_140.m_data[1] = SUB84(auVar19._0_8_,4);
    if (clipMode == CLIPMODE_USE_CLIPPING_BOX) {
      for (uVar11 = 0; uVar11 != 4; uVar11 = uVar11 + 1) {
        fVar18 = (float)(int)(1 - (uVar11 & 0xfffffffe));
        uVar14 = uVar11 & 1;
        fVar21 = local_148.m_data[uVar14];
        fVar2 = lineScreenSpace[-1].m_data[uVar14];
        fVar21 = (float)(~-(uint)(fVar21 == fVar2) & (uint)((fVar18 - fVar21) / (fVar2 - fVar21)) |
                        -(uint)(fVar21 == fVar2) & 0xbf800000);
        if ((0.0 < fVar21) && (fVar21 < 1.0)) {
          uVar15 = (ulong)((uVar14 ^ 1) << 2);
          fVar3 = *(float *)((long)local_148.m_data + uVar15);
          fVar4 = *(float *)((long)lineScreenSpace[-1].m_data + uVar15);
          uVar8 = 1 - (uVar11 >> 1);
          if (fVar2 <= fVar18) {
            uVar8 = uVar11 >> 1;
          }
          (&local_148)[uVar8].m_data[uVar14] = fVar18;
          *(float *)((long)(&local_148)[uVar8].m_data + uVar15) =
               fVar4 * fVar21 + (1.0 - fVar21) * fVar3;
        }
      }
    }
    lineDir.m_data = (float  [2])&DAT_3f8000003f800000;
    tcu::operator+(&local_148,&lineDir);
    tcu::operator*(0.5,lineQuadNormalizedDeviceSpace);
    tcu::operator*(lineQuadScreenSpace,&local_158);
    local_68.m_data = (float  [2])&DAT_3f8000003f800000;
    tcu::operator+(&local_140,&local_68);
    tcu::operator*(0.5,&local_120);
    tcu::operator*(&lineNormalDir,&local_158);
    tcu::operator-(lineScreenSpace + 1,lineScreenSpace);
    normalize<float,2>((tcu *)&lineDir,lineQuadScreenSpace);
    lineNormalDir.m_data[1] = -lineDir.m_data[0];
    lineNormalDir.m_data[0] = lineDir.m_data[1];
    tcu::operator*(fVar17,&lineNormalDir);
    tcu::operator+(lineScreenSpace,lineQuadNormalizedDeviceSpace);
    tcu::operator*(fVar17,&lineNormalDir);
    tcu::operator-(lineScreenSpace,&local_120);
    tcu::operator*(fVar17,&lineNormalDir);
    tcu::operator-(lineScreenSpace + 1,&local_68);
    tcu::operator*(fVar17,&lineNormalDir);
    tcu::operator+(lineScreenSpace + 1,&local_d0);
    tcu::operator/(lineQuadScreenSpace,&local_158);
    tcu::operator*(2.0,&local_68);
    local_d0.m_data = (float  [2])&DAT_3f8000003f800000;
    tcu::operator-(&local_120,&local_d0);
    tcu::operator/(lineQuadScreenSpace + 1,&local_158);
    tcu::operator*(2.0,&local_40);
    local_70.m_data = (float  [2])&DAT_3f8000003f800000;
    tcu::operator-(&local_38,&local_70);
    tcu::operator/(lineQuadScreenSpace + 2,&local_158);
    tcu::operator*(2.0,&local_50);
    local_78.m_data = (float  [2])&DAT_3f8000003f800000;
    tcu::operator-(&local_48,&local_78);
    tcu::operator/(lineQuadScreenSpace + 3,&local_158);
    tcu::operator*(2.0,&local_60);
    local_80.m_data = (float  [2])&DAT_3f8000003f800000;
    tcu::operator-(&local_58,&local_80);
    lVar13 = (lVar16 << 0x21) >> 0x20;
    pSVar1 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar13;
    *(float (*) [2])pSVar1->positions[0].m_data = lineQuadNormalizedDeviceSpace[0].m_data;
    pSVar1->positions[0].m_data[2] = 0.0;
    pSVar1->positions[0].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar13].sharedEdge[0] = false;
    pVVar9 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar13].positions;
    *(float (*) [2])pVVar9[1].m_data = lineQuadNormalizedDeviceSpace[1].m_data;
    pVVar9[1].m_data[2] = 0.0;
    pVVar9[1].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar13].sharedEdge[1] = false;
    pVVar9 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar13].positions;
    *(float (*) [2])pVVar9[2].m_data = lineQuadNormalizedDeviceSpace[2].m_data;
    pVVar9[2].m_data[2] = 0.0;
    pVVar9[2].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar13].sharedEdge[2] = true;
    iVar12 = (int)lVar16 * 2 + 1;
    pSVar1 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar12;
    *(float (*) [2])pSVar1->positions[0].m_data = lineQuadNormalizedDeviceSpace[0].m_data;
    pSVar1->positions[0].m_data[2] = 0.0;
    pSVar1->positions[0].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar12].sharedEdge[0] = true;
    pVVar9 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar12].positions;
    *(float (*) [2])pVVar9[1].m_data = lineQuadNormalizedDeviceSpace[2].m_data;
    pVVar9[1].m_data[2] = 0.0;
    pVVar9[1].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar12].sharedEdge[1] = false;
    pVVar9 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar12].positions;
    *(float (*) [2])pVVar9[2].m_data = lineQuadNormalizedDeviceSpace[3].m_data;
    pVVar9[2].m_data[2] = 0.0;
    pVVar9[2].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar12].sharedEdge[2] = false;
  }
  bVar10 = verifyTriangleGroupRasterization(surface,&triangleScene,args,log,VERIFICATIONMODE_STRICT)
  ;
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&triangleScene);
  return bVar10;
}

Assistant:

bool verifyMultisampleLineGroupRasterization (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, ClipMode clipMode)
{
	// Multisampled line == 2 triangles

	const tcu::Vec2		viewportSize	= tcu::Vec2((float)surface.getWidth(), (float)surface.getHeight());
	const float			halfLineWidth	= scene.lineWidth * 0.5f;
	TriangleSceneSpec	triangleScene;

	triangleScene.triangles.resize(2 * scene.lines.size());
	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		// Transform to screen space, add pixel offsets, convert back to normalized device space, and test as triangles
		tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(scene.lines[lineNdx].positions[0].x() / scene.lines[lineNdx].positions[0].w(), scene.lines[lineNdx].positions[0].y() / scene.lines[lineNdx].positions[0].w()),
			tcu::Vec2(scene.lines[lineNdx].positions[1].x() / scene.lines[lineNdx].positions[1].w(), scene.lines[lineNdx].positions[1].y() / scene.lines[lineNdx].positions[1].w()),
		};

		if (clipMode == CLIPMODE_USE_CLIPPING_BOX)
		{
			applyClippingBox(lineNormalizedDeviceSpace, 1.0f);
		}

		const tcu::Vec2 lineScreenSpace[2] =
		{
			(lineNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
			(lineNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
		};

		const tcu::Vec2 lineDir			= tcu::normalize(lineScreenSpace[1] - lineScreenSpace[0]);
		const tcu::Vec2 lineNormalDir	= tcu::Vec2(lineDir.y(), -lineDir.x());

		const tcu::Vec2 lineQuadScreenSpace[4] =
		{
			lineScreenSpace[0] + lineNormalDir * halfLineWidth,
			lineScreenSpace[0] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] + lineNormalDir * halfLineWidth,
		};
		const tcu::Vec2 lineQuadNormalizedDeviceSpace[4] =
		{
			lineQuadScreenSpace[0] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[1] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[2] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[3] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
		};

		triangleScene.triangles[lineNdx*2 + 0].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[0] = false;
		triangleScene.triangles[lineNdx*2 + 0].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[1].x(), lineQuadNormalizedDeviceSpace[1].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 0].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[2] = true;

		triangleScene.triangles[lineNdx*2 + 1].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[0] = true;
		triangleScene.triangles[lineNdx*2 + 1].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 1].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[3].x(), lineQuadNormalizedDeviceSpace[3].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[2] = false;
	}

	return verifyTriangleGroupRasterization(surface, triangleScene, args, log);
}